

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

longdouble *
trng::math::detail::inv_erfc<long_double>(longdouble *__return_storage_ptr__,longdouble x)

{
  longdouble *plVar1;
  bool bVar2;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar3;
  longdouble in_ST2;
  long local_28;
  ushort uStack_20;
  
  lVar3 = (longdouble)1;
  if (lVar3 <= x || x != lVar3) {
    x = lVar3 - (-lVar3 + x);
  }
  inv_Phi_approx<long_double>(__return_storage_ptr__,x * (longdouble)0.5);
  in_ST0 = _DAT_00265010 * in_ST0;
  uStack_20 = (ushort)((unkuint10)in_ST0 >> 0x40);
  local_28 = SUB108(in_ST0,0);
  bVar2 = ((unkuint10)in_ST0 & 0x7fff) != 0;
  plVar1 = (longdouble *)(ulong)CONCAT31((int3)((uStack_20 & 0x7fff) >> 8),bVar2);
  if (!bVar2 || ((uStack_20 & 0x7fff) - 1 & 0xffff) < 0x7ffe && local_28 < 0) {
    erfcl();
    lVar3 = _DAT_00265020 * (in_ST1 - x);
    plVar1 = (longdouble *)expl();
    lVar3 = lVar3 * in_ST2;
    in_ST0 = in_ST0 - lVar3 / (in_ST0 * lVar3 + (longdouble)1);
  }
  if (ABS(in_ST0) != (longdouble)INFINITY) {
    erfcl();
    plVar1 = (longdouble *)expl();
  }
  return plVar1;
}

Assistant:

TRNG_CUDA_ENABLE T inv_erfc(T x) {
        // step size in the Halley step is proportional to erfc, use symmetry to increase
        // numerical accuracy
        const bool flag{x > 1};
        if (flag)
          x = -(x - 1) + 1;
        T y{-inv_Phi_approx(x / 2) * constants<T>::one_over_sqrt_2};
        // refinement by Halley rational method
        if (isfinite(y)) {
          const T e{erfc(y) - x};
          const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
          y -= u / (1 + y * u);
        }
        // T is a floating point number type with more than 80 bits, a 2nd iteration is
        // required to reach full machine precision
#if __cplusplus >= 201703L
        if constexpr (sizeof(T) > 10) {
#else
#if _MSC_VER
#pragma warning(push)
#pragma warning(disable : 4127)
#endif
        if (sizeof(T) > 10) {
#if _MSC_VER
#pragma warning(pop)
#endif
#endif
          if (isfinite(y)) {
            const T e{erfc(y) - x};
            const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
            y -= u / (1 + y * u);
          }
        }
        return flag ? -y : y;
      }

    }